

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<25UL> *
mserialize::cx_strcat<16ul,7ul,1ul,1ul>
          (cx_string<16UL> *strings,cx_string<7UL> *strings_1,cx_string<1UL> *strings_2,
          cx_string<1UL> *strings_3)

{
  cx_string<1UL> *in_RCX;
  cx_string<7UL> *in_RDX;
  cx_string<16UL> *in_RSI;
  cx_string<25UL> *in_RDI;
  cx_string<1UL> *in_R8;
  size_t s;
  size_t i;
  char *out;
  size_t size [5];
  char *data [5];
  char buffer [26];
  char *in_stack_ffffffffffffff40;
  ulong local_b8;
  char *local_b0;
  size_t local_a0 [5];
  char *local_78;
  data_ref local_70;
  data_ref local_68;
  data_ref local_60;
  data_ref local_58;
  char local_48 [40];
  cx_string<1UL> *local_20;
  cx_string<1UL> *local_18;
  cx_string<7UL> *local_10;
  cx_string<16UL> *local_8;
  
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  memset(local_48,0,0x1a);
  local_78 = "";
  local_70 = cx_string<16UL>::data(local_8);
  local_68 = cx_string<7UL>::data(local_10);
  local_60 = cx_string<1UL>::data(local_18);
  local_58 = cx_string<1UL>::data(local_20);
  local_a0[0] = cx_string<16UL>::size(local_8);
  local_a0[1] = cx_string<7UL>::size(local_10);
  local_a0[2] = cx_string<1UL>::size(local_18);
  local_a0[3] = cx_string<1UL>::size(local_20);
  local_b0 = local_48;
  for (local_b8 = 1; local_b8 < 5; local_b8 = local_b8 + 1) {
    for (in_stack_ffffffffffffff40 = (char *)0x0;
        in_stack_ffffffffffffff40 < (cx_string<25UL> *)local_a0[local_b8 - 1];
        in_stack_ffffffffffffff40 = in_stack_ffffffffffffff40 + 1) {
      *local_b0 = in_stack_ffffffffffffff40[(long)(&local_78)[local_b8]];
      local_b0 = local_b0 + 1;
    }
  }
  cx_string<25UL>::cx_string((cx_string<25UL> *)in_stack_ffffffffffffff40,in_RDI->_data);
  return in_RDI;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}